

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlRegStatePtr xmlRegStatePush(xmlRegParserCtxtPtr ctxt)

{
  int iVar1;
  xmlRegStatePtr *ppxVar2;
  xmlRegStatePtr pxVar3;
  uint uVar4;
  uint uVar5;
  
  iVar1 = ctxt->maxStates;
  if (iVar1 <= ctxt->nbStates) {
    if (iVar1 < 1) {
      uVar5 = 4;
    }
    else {
      uVar5 = 0xffffffff;
      if (iVar1 < 1000000000) {
        uVar4 = iVar1 + 1U >> 1;
        uVar5 = uVar4 + iVar1;
        if ((int)(1000000000 - uVar4) < iVar1) {
          uVar5 = 1000000000;
        }
      }
    }
    if (((int)uVar5 < 0) ||
       (ppxVar2 = (xmlRegStatePtr *)(*xmlRealloc)(ctxt->states,(ulong)uVar5 << 3),
       ppxVar2 == (xmlRegStatePtr *)0x0)) {
      ctxt->error = 2;
      xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                          (xmlError *)0x0);
      return (xmlRegStatePtr)0x0;
    }
    ctxt->states = ppxVar2;
    ctxt->maxStates = uVar5;
  }
  pxVar3 = (xmlRegStatePtr)(*xmlMalloc)(0x38);
  if (pxVar3 == (xmlRegStatePtr)0x0) {
    ctxt->error = 2;
    pxVar3 = (xmlRegStatePtr)0x0;
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                        (xmlError *)0x0);
  }
  else {
    pxVar3->type = 0;
    pxVar3->mark = XML_REGEXP_MARK_NORMAL;
    pxVar3->markd = XML_REGEXP_MARK_NORMAL;
    pxVar3->reached = XML_REGEXP_MARK_NORMAL;
    pxVar3->trans = (xmlRegTrans *)0x0;
    pxVar3->maxTransTo = 0;
    pxVar3->nbTransTo = 0;
    pxVar3->no = 0;
    pxVar3->maxTrans = 0;
    *(undefined8 *)&pxVar3->nbTrans = 0;
    pxVar3->transTo = (int *)0x0;
    pxVar3->type = XML_REGEXP_TRANS_STATE;
    pxVar3->mark = XML_REGEXP_MARK_NORMAL;
  }
  if (pxVar3 == (xmlRegStatePtr)0x0) {
    pxVar3 = (xmlRegStatePtr)0x0;
  }
  else {
    iVar1 = ctxt->nbStates;
    pxVar3->no = iVar1;
    ctxt->nbStates = iVar1 + 1;
    ctxt->states[iVar1] = pxVar3;
  }
  return pxVar3;
}

Assistant:

static xmlRegStatePtr
xmlRegStatePush(xmlRegParserCtxtPtr ctxt) {
    xmlRegStatePtr state;

    if (ctxt->nbStates >= ctxt->maxStates) {
	xmlRegStatePtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->maxStates, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
	if (newSize < 0) {
	    xmlRegexpErrMemory(ctxt);
	    return(NULL);
	}
	tmp = xmlRealloc(ctxt->states, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    return(NULL);
	}
	ctxt->states = tmp;
	ctxt->maxStates = newSize;
    }

    state = xmlRegNewState(ctxt);
    if (state == NULL)
        return(NULL);

    state->no = ctxt->nbStates;
    ctxt->states[ctxt->nbStates++] = state;

    return(state);
}